

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

FileDescriptor * __thiscall
google::protobuf::DescriptorBuilder::BuildFile(DescriptorBuilder *this,FileDescriptorProto *proto)

{
  pointer pbVar1;
  __type_conflict _Var2;
  FileDescriptor *pFVar3;
  DescriptorPool *this_00;
  Tables *this_01;
  long lVar4;
  int i;
  ulong uVar5;
  FileDescriptorProto existing_proto;
  string sStack_148;
  string local_128;
  FileDescriptorProto local_108;
  
  std::__cxx11::string::_M_assign((string *)&this->filename_);
  pFVar3 = DescriptorPool::Tables::FindFile(this->tables_,&this->filename_);
  if (pFVar3 != (FileDescriptor *)0x0) {
    FileDescriptorProto::FileDescriptorProto(&local_108);
    FileDescriptor::CopyTo(pFVar3,&local_108);
    if ((*(int *)(pFVar3 + 0x3c) == 2) && (((proto->_has_bits_).has_bits_[0] & 4) != 0)) {
      FileDescriptorProto::set_syntax(&local_108,"proto2");
    }
    MessageLite::SerializeAsString_abi_cxx11_(&sStack_148,(MessageLite *)&local_108);
    MessageLite::SerializeAsString_abi_cxx11_(&local_128,(MessageLite *)proto);
    _Var2 = std::operator==(&sStack_148,&local_128);
    std::__cxx11::string::~string((string *)&local_128);
    std::__cxx11::string::~string((string *)&sStack_148);
    FileDescriptorProto::~FileDescriptorProto(&local_108);
    if (_Var2) {
      return pFVar3;
    }
  }
  lVar4 = 0;
  uVar5 = 0;
  while( true ) {
    this_01 = this->tables_;
    pbVar1 = (this_01->pending_files_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this_01->pending_files_).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) <= uVar5)
    break;
    _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&(pbVar1->_M_dataplus)._M_p + lVar4),(proto->name_).ptr_);
    if (_Var2) {
      AddRecursiveImportError(this,proto,(int)uVar5);
      goto LAB_0029344f;
    }
    uVar5 = uVar5 + 1;
    lVar4 = lVar4 + 0x20;
  }
  if ((this->pool_->lazily_build_dependencies_ == false) &&
     (this->pool_->fallback_database_ != (DescriptorDatabase *)0x0)) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this_01->pending_files_,(proto->name_).ptr_);
    for (lVar4 = 0; lVar4 < (proto->dependency_).super_RepeatedPtrFieldBase.current_size_;
        lVar4 = lVar4 + 1) {
      pFVar3 = DescriptorPool::Tables::FindFile
                         (this->tables_,
                          (string *)
                          ((proto->dependency_).super_RepeatedPtrFieldBase.rep_)->elements[lVar4]);
      if (pFVar3 == (FileDescriptor *)0x0) {
        this_00 = this->pool_;
        if (this_00->underlay_ != (DescriptorPool *)0x0) {
          pFVar3 = DescriptorPool::FindFileByName
                             (this_00->underlay_,
                              (string *)
                              ((proto->dependency_).super_RepeatedPtrFieldBase.rep_)->elements
                              [lVar4]);
          if (pFVar3 != (FileDescriptor *)0x0) goto LAB_002933fb;
          this_00 = this->pool_;
        }
        DescriptorPool::TryFindFileInFallbackDatabase
                  (this_00,(string *)
                           ((proto->dependency_).super_RepeatedPtrFieldBase.rep_)->elements[lVar4]);
      }
LAB_002933fb:
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::pop_back(&this->tables_->pending_files_);
    this_01 = this->tables_;
  }
  DescriptorPool::Tables::AddCheckpoint(this_01);
  pFVar3 = BuildFileImpl(this,proto);
  FileDescriptorTables::FinalizeTables(this->file_tables_);
  if (pFVar3 == (FileDescriptor *)0x0) {
    DescriptorPool::Tables::RollbackToLastCheckpoint(this->tables_);
LAB_0029344f:
    pFVar3 = (FileDescriptor *)0x0;
  }
  else {
    DescriptorPool::Tables::ClearLastCheckpoint(this->tables_);
    pFVar3[0x41] = (FileDescriptor)0x1;
  }
  return pFVar3;
}

Assistant:

const FileDescriptor* DescriptorBuilder::BuildFile(
    const FileDescriptorProto& proto) {
  filename_ = proto.name();

  // Check if the file already exists and is identical to the one being built.
  // Note:  This only works if the input is canonical -- that is, it
  //   fully-qualifies all type names, has no UninterpretedOptions, etc.
  //   This is fine, because this idempotency "feature" really only exists to
  //   accommodate one hack in the proto1->proto2 migration layer.
  const FileDescriptor* existing_file = tables_->FindFile(filename_);
  if (existing_file != nullptr) {
    // File already in pool.  Compare the existing one to the input.
    if (ExistingFileMatchesProto(existing_file, proto)) {
      // They're identical.  Return the existing descriptor.
      return existing_file;
    }

    // Not a match.  The error will be detected and handled later.
  }

  // Check to see if this file is already on the pending files list.
  // TODO(kenton):  Allow recursive imports?  It may not work with some
  //   (most?) programming languages.  E.g., in C++, a forward declaration
  //   of a type is not sufficient to allow it to be used even in a
  //   generated header file due to inlining.  This could perhaps be
  //   worked around using tricks involving inserting #include statements
  //   mid-file, but that's pretty ugly, and I'm pretty sure there are
  //   some languages out there that do not allow recursive dependencies
  //   at all.
  for (int i = 0; i < tables_->pending_files_.size(); i++) {
    if (tables_->pending_files_[i] == proto.name()) {
      AddRecursiveImportError(proto, i);
      return nullptr;
    }
  }

  // If we have a fallback_database_, and we aren't doing lazy import building,
  // attempt to load all dependencies now, before checkpointing tables_.  This
  // avoids confusion with recursive checkpoints.
  if (!pool_->lazily_build_dependencies_) {
    if (pool_->fallback_database_ != nullptr) {
      tables_->pending_files_.push_back(proto.name());
      for (int i = 0; i < proto.dependency_size(); i++) {
        if (tables_->FindFile(proto.dependency(i)) == nullptr &&
            (pool_->underlay_ == nullptr ||
             pool_->underlay_->FindFileByName(proto.dependency(i)) ==
                 nullptr)) {
          // We don't care what this returns since we'll find out below anyway.
          pool_->TryFindFileInFallbackDatabase(proto.dependency(i));
        }
      }
      tables_->pending_files_.pop_back();
    }
  }

  // Checkpoint the tables so that we can roll back if something goes wrong.
  tables_->AddCheckpoint();

  FileDescriptor* result = BuildFileImpl(proto);

  file_tables_->FinalizeTables();
  if (result) {
    tables_->ClearLastCheckpoint();
    result->finished_building_ = true;
  } else {
    tables_->RollbackToLastCheckpoint();
  }

  return result;
}